

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGenerators::ReadAutogenInfoFile
          (cmQtAutoGenerators *this,cmMakefile *makefile,string *targetDirectory,string *config)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  mapped_type *this_00;
  _Alloc_hider this_01;
  undefined8 uVar7;
  iterator fileIt;
  iterator optionIt;
  undefined8 source;
  pointer pbVar8;
  string rccSources;
  string compileDefsProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccOptionsVec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicFilesVec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicOptionsVec;
  string filename;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  cmMakefile *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  allocator local_99;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined8 local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  long local_40;
  long local_38;
  
  local_f0 = makefile;
  cmsys::SystemTools::CollapseFullPath(&local_60,targetDirectory);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_60);
  std::__cxx11::string::append((char *)&local_60);
  bVar2 = cmMakefile::ReadListFile(local_f0,local_60._M_dataplus._M_p);
  if (bVar2) {
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_QT_VERSION_MAJOR","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->QtMajorVersion)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)this,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    iVar3 = std::__cxx11::string::compare((char *)this);
    if (iVar3 == 0) {
      local_118._M_allocated_capacity = (size_type)&local_108;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"AM_Qt5Core_VERSION_MAJOR","");
      pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
      pcVar5 = (char *)(this->QtMajorVersion)._M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)this,0,pcVar5,(ulong)pcVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1)
        ;
      }
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_SOURCES","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->Sources)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->Sources,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"AM_RCC_SOURCES","");
    pcVar5 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_e8);
    std::__cxx11::string::string
              ((string *)local_118._M_local_buf,pcVar5,(allocator *)local_c8._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity != &local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
    }
    cmSystemTools::ExpandListArgument((string *)&local_118,&this->RccSources,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_SKIP_MOC","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->SkipMoc)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->SkipMoc,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_SKIP_UIC","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->SkipUic)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->SkipUic,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_HEADERS","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->Headers)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->Headers,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE","");
    bVar2 = cmMakefile::IsOn(local_f0,(string *)&local_118);
    this->IncludeProjectDirsBefore = bVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"AM_CMAKE_CURRENT_SOURCE_DIR","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->Srcdir)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->Srcdir,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"AM_CMAKE_CURRENT_BINARY_DIR","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->Builddir)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->Builddir,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_QT_MOC_EXECUTABLE","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->MocExecutable)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->MocExecutable,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_QT_UIC_EXECUTABLE","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->UicExecutable)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->UicExecutable,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_QT_RCC_EXECUTABLE","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->RccExecutable)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->RccExecutable,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"AM_MOC_COMPILE_DEFINITIONS","");
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_118._M_allocated_capacity,
               local_118._M_allocated_capacity + local_118._8_8_);
    if (config->_M_string_length != 0) {
      std::__cxx11::string::append(local_e8._M_local_buf);
      std::__cxx11::string::_M_append(local_e8._M_local_buf,(ulong)(config->_M_dataplus)._M_p);
    }
    pcVar5 = cmMakefile::GetDefinition(local_f0,(string *)&local_e8);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    }
    pcVar4 = (char *)(this->MocCompileDefinitionsStr)._M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&this->MocCompileDefinitionsStr,0,pcVar4,(ulong)pcVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity != &local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_MOC_INCLUDES","");
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_118._M_allocated_capacity,
               local_118._M_allocated_capacity + local_118._8_8_);
    if (config->_M_string_length != 0) {
      std::__cxx11::string::append(local_e8._M_local_buf);
      std::__cxx11::string::_M_append(local_e8._M_local_buf,(ulong)(config->_M_dataplus)._M_p);
    }
    pcVar5 = cmMakefile::GetDefinition(local_f0,(string *)&local_e8);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    }
    pcVar4 = (char *)(this->MocIncludesStr)._M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&this->MocIncludesStr,0,pcVar4,(ulong)pcVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity != &local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_MOC_OPTIONS","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->MocOptionsStr)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->MocOptionsStr,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_CMAKE_BINARY_DIR","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->ProjectBinaryDir)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->ProjectBinaryDir,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_CMAKE_SOURCE_DIR","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->ProjectSourceDir)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->ProjectSourceDir,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_TARGET_NAME","");
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->TargetName)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->TargetName,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_ORIGIN_TARGET_NAME","")
    ;
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    pcVar5 = (char *)(this->OriginTargetName)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->OriginTargetName,0,pcVar5,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_UIC_OPTIONS_FILES","");
    pcVar5 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    local_118._M_allocated_capacity = (size_type)&local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_UIC_TARGET_OPTIONS","")
    ;
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_118._M_allocated_capacity,
               local_118._M_allocated_capacity + local_118._8_8_);
    if (config->_M_string_length != 0) {
      std::__cxx11::string::append(local_e8._M_local_buf);
      std::__cxx11::string::_M_append(local_e8._M_local_buf,(ulong)(config->_M_dataplus)._M_p);
    }
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_e8);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
    }
    std::__cxx11::string::string
              ((string *)local_c8._M_local_buf,pcVar4,(allocator *)local_98._M_local_buf);
    cmSystemTools::ExpandListArgument((string *)&local_c8,&this->UicTargetOptions,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,local_b8._M_allocated_capacity + 1);
    }
    local_c8._M_allocated_capacity = (size_type)&local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"AM_UIC_OPTIONS_OPTIONS","")
    ;
    pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,local_b8._M_allocated_capacity + 1);
    }
    local_98._M_allocated_capacity = 0;
    local_98._8_8_ = 0;
    local_88 = 0;
    std::__cxx11::string::string((string *)local_c8._M_local_buf,pcVar5,(allocator *)&local_78);
    cmSystemTools::ExpandListArgument
              ((string *)&local_c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,local_b8._M_allocated_capacity + 1);
    }
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)local_c8._M_local_buf,pcVar4,&local_99);
    cmSystemTools::ExpandListArgument((string *)&local_c8,&local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,local_b8._M_allocated_capacity + 1);
    }
    if (local_98._8_8_ - local_98._0_8_ ==
        (long)local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      if (local_98._M_allocated_capacity != local_98._8_8_) {
        uVar7 = local_98._M_allocated_capacity;
        pbVar8 = local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          cmsys::SystemTools::ReplaceString(pbVar8,"@list_sep@",";");
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->UicOptions,(key_type *)uVar7);
          std::__cxx11::string::_M_assign((string *)pmVar6);
          uVar7 = uVar7 + 0x20;
          pbVar8 = pbVar8 + 1;
        } while (uVar7 != local_98._8_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_allocated_capacity != &local_d8) {
        operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1)
        ;
      }
      local_118._M_allocated_capacity = (size_type)&local_108;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"AM_RCC_OPTIONS_FILES","");
      pcVar5 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1)
        ;
      }
      local_118._M_allocated_capacity = (size_type)&local_108;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"AM_RCC_OPTIONS_OPTIONS","");
      pcVar4 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1)
        ;
      }
      local_e8._M_allocated_capacity = 0;
      local_e8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_d8._M_allocated_capacity = 0;
      std::__cxx11::string::string
                ((string *)local_118._M_local_buf,pcVar5,(allocator *)local_c8._M_local_buf);
      cmSystemTools::ExpandListArgument
                ((string *)&local_118,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1)
        ;
      }
      local_c8._M_allocated_capacity = 0;
      local_c8._8_8_ = 0;
      local_b8._M_allocated_capacity = 0;
      std::__cxx11::string::string
                ((string *)local_118._M_local_buf,pcVar4,(allocator *)local_98._M_local_buf);
      cmSystemTools::ExpandListArgument
                ((string *)&local_118,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_c8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1)
        ;
      }
      if (local_e8._8_8_ - local_e8._0_8_ == local_c8._8_8_ - local_c8._0_8_) {
        if (local_e8._M_allocated_capacity != local_e8._8_8_) {
          uVar7 = local_e8._M_allocated_capacity;
          source = local_c8._M_allocated_capacity;
          do {
            cmsys::SystemTools::ReplaceString((string *)source,"@list_sep@",";");
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this->RccOptions,(key_type *)uVar7);
            std::__cxx11::string::_M_assign((string *)pmVar6);
            uVar7 = uVar7 + 0x20;
            source = source + 0x20;
          } while (uVar7 != local_e8._8_8_);
        }
        local_118._M_allocated_capacity = (size_type)&local_108;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_RCC_INPUTS","");
        pcVar5 = cmMakefile::GetSafeDefinition(local_f0,(string *)&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_allocated_capacity != &local_108) {
          operator_delete((void *)local_118._M_allocated_capacity,
                          local_108._M_allocated_capacity + 1);
        }
        local_98._M_allocated_capacity = 0;
        local_98._8_8_ = 0;
        local_88 = 0;
        std::__cxx11::string::string((string *)local_118._M_local_buf,pcVar5,(allocator *)&local_78)
        ;
        this_01._M_p = (pointer)&local_98;
        cmSystemTools::ExpandListArgument
                  ((string *)&local_118,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_01._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_allocated_capacity != &local_108) {
          this_01._M_p = (pointer)(local_108._M_allocated_capacity + 1);
          operator_delete((void *)local_118._M_allocated_capacity,(ulong)this_01._M_p);
        }
        pbVar8 = (this->RccSources).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (this->RccSources).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_38 = (long)pbVar1 - (long)pbVar8;
        local_40 = local_98._8_8_ - local_98._0_8_;
        if (local_38 == local_40) {
          if (pbVar8 != pbVar1) {
            uVar7 = local_98._M_allocated_capacity;
            do {
              cmsys::SystemTools::ReplaceString((string *)uVar7,"@list_sep@",";");
              local_118._M_allocated_capacity = 0;
              local_118._8_8_ = 0;
              local_108._M_allocated_capacity = 0;
              cmSystemTools::ExpandListArgument
                        ((string *)uVar7,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_118,false);
              this_00 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[](&this->RccInputs,pbVar8);
              this_01._M_p = (pointer)&local_118;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_118);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_118);
              pbVar8 = pbVar8 + 1;
              uVar7 = uVar7 + 0x20;
            } while (pbVar8 != (this->RccSources).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
        else {
          this_01._M_p = local_60._M_dataplus._M_p;
          cmSystemTools::Error
                    ("Error processing file: ",local_60._M_dataplus._M_p,(char *)0x0,(char *)0x0);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_e8);
        if (local_38 == local_40) {
          MakeCompileSettingsString_abi_cxx11_
                    ((string *)&local_118,(cmQtAutoGenerators *)this_01._M_p,local_f0);
          std::__cxx11::string::operator=
                    ((string *)&this->CurrentCompileSettingsStr,(string *)local_118._M_local_buf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_allocated_capacity != &local_108) {
            operator_delete((void *)local_118._M_allocated_capacity,
                            local_108._M_allocated_capacity + 1);
          }
          local_118._M_allocated_capacity = (size_type)&local_108;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AM_RELAXED_MODE","")
          ;
          bVar2 = cmMakefile::IsOn(local_f0,(string *)&local_118);
          this->RelaxedMode = bVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_allocated_capacity != &local_108) {
            operator_delete((void *)local_118._M_allocated_capacity,
                            local_108._M_allocated_capacity + 1);
          }
          bVar2 = true;
          goto LAB_002664d5;
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_e8);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_allocated_capacity != &local_d8) {
        operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1)
        ;
      }
    }
    bVar2 = false;
  }
  else {
    bVar2 = false;
    cmSystemTools::Error
              ("Error processing file: ",local_60._M_dataplus._M_p,(char *)0x0,(char *)0x0);
  }
LAB_002664d5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenerators::ReadAutogenInfoFile(cmMakefile* makefile,
                                      const std::string& targetDirectory,
                                      const std::string& config)
{
  std::string filename(
      cmSystemTools::CollapseFullPath(targetDirectory));
  cmSystemTools::ConvertToUnixSlashes(filename);
  filename += "/AutogenInfo.cmake";

  if (!makefile->ReadListFile(filename.c_str()))
    {
    cmSystemTools::Error("Error processing file: ", filename.c_str());
    return false;
    }

  this->QtMajorVersion = makefile->GetSafeDefinition("AM_QT_VERSION_MAJOR");
  if (this->QtMajorVersion == "")
    {
    this->QtMajorVersion = makefile->GetSafeDefinition(
                                     "AM_Qt5Core_VERSION_MAJOR");
    }
  this->Sources = makefile->GetSafeDefinition("AM_SOURCES");
  {
  std::string rccSources = makefile->GetSafeDefinition("AM_RCC_SOURCES");
  cmSystemTools::ExpandListArgument(rccSources, this->RccSources);
  }
  this->SkipMoc = makefile->GetSafeDefinition("AM_SKIP_MOC");
  this->SkipUic = makefile->GetSafeDefinition("AM_SKIP_UIC");
  this->Headers = makefile->GetSafeDefinition("AM_HEADERS");
  this->IncludeProjectDirsBefore = makefile->IsOn(
                                "AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE");
  this->Srcdir = makefile->GetSafeDefinition("AM_CMAKE_CURRENT_SOURCE_DIR");
  this->Builddir = makefile->GetSafeDefinition("AM_CMAKE_CURRENT_BINARY_DIR");
  this->MocExecutable = makefile->GetSafeDefinition("AM_QT_MOC_EXECUTABLE");
  this->UicExecutable = makefile->GetSafeDefinition("AM_QT_UIC_EXECUTABLE");
  this->RccExecutable = makefile->GetSafeDefinition("AM_QT_RCC_EXECUTABLE");
  {
  std::string compileDefsPropOrig = "AM_MOC_COMPILE_DEFINITIONS";
  std::string compileDefsProp = compileDefsPropOrig;
  if(!config.empty())
    {
    compileDefsProp += "_";
    compileDefsProp += config;
    }
  const char *compileDefs = makefile->GetDefinition(compileDefsProp);
  this->MocCompileDefinitionsStr = compileDefs ? compileDefs
                  : makefile->GetSafeDefinition(compileDefsPropOrig);
  }
  {
  std::string includesPropOrig = "AM_MOC_INCLUDES";
  std::string includesProp = includesPropOrig;
  if(!config.empty())
    {
    includesProp += "_";
    includesProp += config;
    }
  const char *includes = makefile->GetDefinition(includesProp);
  this->MocIncludesStr = includes ? includes
                      : makefile->GetSafeDefinition(includesPropOrig);
  }
  this->MocOptionsStr = makefile->GetSafeDefinition("AM_MOC_OPTIONS");
  this->ProjectBinaryDir = makefile->GetSafeDefinition("AM_CMAKE_BINARY_DIR");
  this->ProjectSourceDir = makefile->GetSafeDefinition("AM_CMAKE_SOURCE_DIR");
  this->TargetName = makefile->GetSafeDefinition("AM_TARGET_NAME");
  this->OriginTargetName
                      = makefile->GetSafeDefinition("AM_ORIGIN_TARGET_NAME");

  {
  const char *uicOptionsFiles
                        = makefile->GetSafeDefinition("AM_UIC_OPTIONS_FILES");
  std::string uicOptionsPropOrig = "AM_UIC_TARGET_OPTIONS";
  std::string uicOptionsProp = uicOptionsPropOrig;
  if(!config.empty())
    {
    uicOptionsProp += "_";
    uicOptionsProp += config;
    }
  const char *uicTargetOptions
                        = makefile->GetSafeDefinition(uicOptionsProp);
  cmSystemTools::ExpandListArgument(
      uicTargetOptions ? uicTargetOptions
                    : makefile->GetSafeDefinition(uicOptionsPropOrig),
    this->UicTargetOptions);
  const char *uicOptionsOptions
                      = makefile->GetSafeDefinition("AM_UIC_OPTIONS_OPTIONS");
  std::vector<std::string> uicFilesVec;
  cmSystemTools::ExpandListArgument(uicOptionsFiles, uicFilesVec);
  std::vector<std::string> uicOptionsVec;
  cmSystemTools::ExpandListArgument(uicOptionsOptions, uicOptionsVec);
  if (uicFilesVec.size() != uicOptionsVec.size())
    {
    return false;
    }
  for (std::vector<std::string>::iterator fileIt = uicFilesVec.begin(),
                                            optionIt = uicOptionsVec.begin();
                                            fileIt != uicFilesVec.end();
                                            ++fileIt, ++optionIt)
    {
    cmSystemTools::ReplaceString(*optionIt, "@list_sep@", ";");
    this->UicOptions[*fileIt] = *optionIt;
    }
  }
  {
  const char *rccOptionsFiles
                        = makefile->GetSafeDefinition("AM_RCC_OPTIONS_FILES");
  const char *rccOptionsOptions
                      = makefile->GetSafeDefinition("AM_RCC_OPTIONS_OPTIONS");
  std::vector<std::string> rccFilesVec;
  cmSystemTools::ExpandListArgument(rccOptionsFiles, rccFilesVec);
  std::vector<std::string> rccOptionsVec;
  cmSystemTools::ExpandListArgument(rccOptionsOptions, rccOptionsVec);
  if (rccFilesVec.size() != rccOptionsVec.size())
    {
    return false;
    }
  for (std::vector<std::string>::iterator fileIt = rccFilesVec.begin(),
                                            optionIt = rccOptionsVec.begin();
                                            fileIt != rccFilesVec.end();
                                            ++fileIt, ++optionIt)
    {
    cmSystemTools::ReplaceString(*optionIt, "@list_sep@", ";");
    this->RccOptions[*fileIt] = *optionIt;
    }

  const char *rccInputs = makefile->GetSafeDefinition("AM_RCC_INPUTS");
  std::vector<std::string> rccInputLists;
  cmSystemTools::ExpandListArgument(rccInputs, rccInputLists);

  if (this->RccSources.size() != rccInputLists.size())
    {
    cmSystemTools::Error("Error processing file: ", filename.c_str());
    return false;
    }

  for (std::vector<std::string>::iterator fileIt = this->RccSources.begin(),
                                            inputIt = rccInputLists.begin();
                                            fileIt != this->RccSources.end();
                                            ++fileIt, ++inputIt)
    {
    cmSystemTools::ReplaceString(*inputIt, "@list_sep@", ";");
    std::vector<std::string> rccInputFiles;
    cmSystemTools::ExpandListArgument(*inputIt, rccInputFiles);

    this->RccInputs[*fileIt] = rccInputFiles;
    }
  }
  this->CurrentCompileSettingsStr = this->MakeCompileSettingsString(makefile);

  this->RelaxedMode = makefile->IsOn("AM_RELAXED_MODE");

  return true;
}